

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::on_torrent_aborted(torrent *this)

{
  _Atomic_word *p_Var1;
  disk_interface *pdVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 auStack_38 [24];
  element_type *peStack_20;
  
  pdVar2 = (this->m_storage).m_disk_io;
  if (pdVar2 != (disk_interface *)0x0) {
    (*pdVar2->_vptr_disk_interface[1])(pdVar2,(ulong)(this->m_storage).m_idx.m_val);
  }
  (this->m_storage).m_disk_io = (disk_interface *)0x0;
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)auStack_38);
  auStack_38._16_8_ = (this->m_userdata).m_type_ptr;
  peStack_20 = (element_type *)(this->m_userdata).m_client_ptr;
  alert_manager::
  emplace_alert<libtorrent::torrent_removed_alert,libtorrent::torrent_handle,libtorrent::info_hash_t_const&,libtorrent::client_data_t>
            ((alert_manager *)CONCAT44(extraout_var,iVar3),(torrent_handle *)auStack_38,
             &this->m_info_hash,(client_data_t *)(auStack_38 + 0x10));
  if ((piece_picker *)auStack_38._8_8_ != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)(auStack_38._8_8_ + 0xc);
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(_Atomic_word *)(auStack_38._8_8_ + 0xc);
      *(int *)(auStack_38._8_8_ + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(*(_func_int ***)auStack_38._8_8_)[3])();
    }
  }
  return;
}

Assistant:

void torrent::on_torrent_aborted()
	{
		TORRENT_ASSERT(is_single_thread());

		// there should be no more disk activity for this torrent now, we can
		// release the disk io handle
		m_storage.reset();

		alerts().emplace_alert<torrent_removed_alert>(get_handle()
			, info_hash(), get_userdata());
	}